

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O0

void cfd::capi::FreeBufferOnError
               (char **pointer1,char **pointer2,char **pointer3,char **pointer4,char **pointer5,
               char **pointer6)

{
  size_t idx;
  char **pointer_list [6];
  ulong local_70;
  long local_68 [13];
  
  for (local_70 = 0; local_70 < 6; local_70 = local_70 + 1) {
    if ((local_68[local_70] != 0) && (*(long *)local_68[local_70] != 0)) {
      free(*(void **)local_68[local_70]);
      *(undefined8 *)local_68[local_70] = 0;
    }
  }
  return;
}

Assistant:

void FreeBufferOnError(
    char** pointer1, char** pointer2, char** pointer3, char** pointer4,
    char** pointer5, char** pointer6) {
  char** pointer_list[] = {pointer1, pointer2, pointer3,
                           pointer4, pointer5, pointer6};
  for (size_t idx = 0; idx < 6; ++idx) {
    if (pointer_list[idx] != nullptr) {
      if (*(pointer_list[idx]) != nullptr) {
        ::free(*(pointer_list[idx]));
        *(pointer_list[idx]) = nullptr;
      }
    }
  }
}